

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe53At3(uint8_t *buf)

{
  return (ulong)(*buf >> 3) |
         (ulong)buf[1] << 5 |
         (ulong)((uint)buf[2] << 0xd | (uint)buf[3] << 0x15) |
         ((ulong)buf[4] | (ulong)((uint)buf[5] << 8 | (uint)buf[6] << 0x10)) << 0x1d;
}

Assistant:

std::uint64_t readFlUIntLe53At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 5;
    res |= (buf[0] >> 3);
    res &= UINT64_C(0x1fffffffffffff);
    return res;
}